

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdfastpfor.h
# Opt level: O0

void __thiscall
FastPForLib::SIMDFastPFor<4U>::__encodeArray
          (SIMDFastPFor<4U> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  reference pvVar2;
  uint *puVar3;
  reference pvVar4;
  size_type sVar5;
  undefined4 *in_RCX;
  long in_RDX;
  byte *pbVar6;
  uint *puVar7;
  long in_RSI;
  uint32_t *in_RDI;
  long *in_R8;
  uint8_t *unaff_retaddr;
  uint8_t *in_stack_00000008;
  uint8_t *in_stack_00000010;
  uint32_t *in_stack_00000018;
  SIMDFastPFor<4U> *in_stack_00000020;
  uint32_t k_3;
  uint32_t k_2;
  uint32_t bitmap;
  uint8_t *pad8;
  uint32_t bytescontainersize;
  uint32_t k_1;
  uint32_t maxval;
  vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
  *thisexceptioncontainer;
  uint8_t maxb;
  uint8_t bestcexcept;
  uint8_t bestb;
  uint32_t *final;
  uint8_t *bc;
  uint32_t k;
  uint32_t *headerout;
  uint32_t *initout;
  value_type_conflict1 *in_stack_ffffffffffffff58;
  vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
  *in_stack_ffffffffffffff60;
  uint *__dest;
  undefined4 in_stack_ffffffffffffff78;
  uint local_80;
  uint local_7c;
  uint *local_78;
  uint local_68;
  byte local_53;
  byte local_52;
  byte local_51;
  byte *local_48;
  uint local_3c;
  uint *local_20;
  long local_10;
  
  checkifdivisibleby((size_t)unaff_retaddr,(uint32_t)((ulong)in_RDI >> 0x20));
  local_20 = in_RCX + 1;
  for (local_3c = 0; local_3c < 0x21; local_3c = local_3c + 1) {
    std::
    vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
    ::operator[]((vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                  *)(in_RDI + 4),(ulong)local_3c);
    std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::clear
              ((vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_> *)
               0x1427a2);
  }
  local_48 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 10),0);
  for (local_10 = in_RSI; local_10 + 0x200U <= (ulong)(in_RSI + in_RDX * 4);
      local_10 = local_10 + 0x200) {
    getBestBFromData(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                     unaff_retaddr);
    *local_48 = local_51;
    pbVar6 = local_48 + 2;
    local_48[1] = local_52;
    if (local_52 != 0) {
      local_48 = local_48 + 3;
      *pbVar6 = local_53;
      std::
      vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
      ::operator[]((vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                    *)(in_RDI + 4),(long)(int)((uint)local_53 - (uint)local_51));
      for (local_68 = 0; pbVar6 = local_48, local_68 < 0x80; local_68 = local_68 + 1) {
        if ((uint)(1 << (local_51 & 0x1f)) <= *(uint *)(local_10 + (ulong)local_68 * 4)) {
          std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::
          push_back(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
          *local_48 = (byte)local_68;
          local_48 = local_48 + 1;
        }
      }
    }
    local_48 = pbVar6;
    local_20 = packblockupsimd((uint32_t *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0);
  }
  *in_RCX = (int)((long)local_20 - (long)in_RCX >> 2);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 10),0);
  uVar1 = (int)local_48 - (int)pvVar2;
  puVar7 = local_20 + 1;
  *local_20 = uVar1;
  __dest = puVar7;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 10),0);
  memcpy(__dest,pvVar2,(ulong)uVar1);
  puVar3 = (uint *)(((ulong)uVar1 + 3 & 0xfffffffffffffffc) + (long)puVar7);
  local_78 = (uint *)((long)puVar7 + (ulong)uVar1);
  while (local_78 < puVar3) {
    *(undefined1 *)local_78 = 0;
    local_78 = (uint *)((long)local_78 + 1);
  }
  local_7c = 0;
  for (local_80 = 2; local_80 < 0x21; local_80 = local_80 + 1) {
    pvVar4 = std::
             vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                           *)(in_RDI + 4),(ulong)local_80);
    sVar5 = std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::size
                      (pvVar4);
    if (sVar5 != 0) {
      local_7c = 1 << ((char)local_80 - 1U & 0x1f) | local_7c;
    }
  }
  local_20 = puVar3 + 1;
  *puVar3 = local_7c;
  for (uVar1 = 2; uVar1 < 0x21; uVar1 = uVar1 + 1) {
    pvVar4 = std::
             vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                           *)(in_RDI + 4),(ulong)uVar1);
    sVar5 = std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::size
                      (pvVar4);
    if (sVar5 != 0) {
      std::
      vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
      ::operator[]((vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                    *)(in_RDI + 4),(ulong)uVar1);
      local_20 = SIMDFastPFor<4u>::
                 packmeupwithoutmasksimd<std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
                           ((vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                             *)CONCAT44(uVar1,in_stack_ffffffffffffff78),in_RDI,
                            (uint32_t)((ulong)__dest >> 0x20));
    }
  }
  *in_R8 = (long)local_20 - (long)in_RCX >> 2;
  return;
}

Assistant:

void __encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                     size_t &nvalue) {
    uint32_t *const initout = out; // keep track of this
    checkifdivisibleby(length, BlockSize);
    uint32_t *const headerout = out++; // keep track of this
    for (uint32_t k = 0; k < 32 + 1; ++k)
      datatobepacked[k].clear();
    uint8_t *bc = &bytescontainer[0];
    for (const uint32_t *const final = in + length; (in + BlockSize <= final);
         in += BlockSize) {
      uint8_t bestb, bestcexcept, maxb;
      getBestBFromData(in, bestb, bestcexcept, maxb);
      *bc++ = bestb;
      *bc++ = bestcexcept;
      if (bestcexcept > 0) {
        *bc++ = maxb;
        std::vector<uint32_t, cacheallocator> &thisexceptioncontainer =
            datatobepacked[maxb - bestb];
        const uint32_t maxval = 1U << bestb;
        for (uint32_t k = 0; k < BlockSize; ++k) {
          if (in[k] >= maxval) {
            // we have an exception
            thisexceptioncontainer.push_back(in[k] >> bestb);
            *bc++ = static_cast<uint8_t>(k);
          }
        }
      }
      out = packblockupsimd(in, out, bestb);
    }
    headerout[0] = static_cast<uint32_t>(out - headerout);
    const uint32_t bytescontainersize =
        static_cast<uint32_t>(bc - &bytescontainer[0]);
    *(out++) = bytescontainersize;
    memcpy(out, &bytescontainer[0], bytescontainersize);
    uint8_t* pad8 = (uint8_t*)out + bytescontainersize;
    out += (bytescontainersize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    while (pad8 < (uint8_t*)out)
        *pad8++ = 0; // clear padding bytes

    uint32_t bitmap = 0;
    for (uint32_t k = 2; k <= 32; ++k) {
      if (datatobepacked[k].size() != 0)
        bitmap |= (1U << (k - 1));
    }
    *(out++) = bitmap;
    for (uint32_t k = 2; k <= 32; ++k) {
      if (datatobepacked[k].size() > 0)
        out = packmeupwithoutmasksimd(datatobepacked[k], out, k);
    }
    nvalue = out - initout;
  }